

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddExtension(Tables *this,FieldDescriptor *field)

{
  bool bVar1;
  int iVar2;
  Descriptor *this_00;
  FieldDescriptor *in_RSI;
  DescriptorIntPair key;
  undefined4 in_stack_ffffffffffffffc8;
  first_type *in_stack_ffffffffffffffd8;
  map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
  *in_stack_ffffffffffffffe0;
  
  this_00 = FieldDescriptor::containing_type(in_RSI);
  iVar2 = FieldDescriptor::number(in_RSI);
  std::pair<const_google::protobuf::Descriptor_*,_int>::
  pair<const_google::protobuf::Descriptor_*,_int,_true>
            ((pair<const_google::protobuf::Descriptor_*,_int> *)&stack0xffffffffffffffd8,
             (Descriptor **)&stack0xffffffffffffffd0,(int *)&stack0xffffffffffffffcc);
  bVar1 = InsertIfNotPresent<std::map<std::pair<google::protobuf::Descriptor_const*,int>,google::protobuf::FieldDescriptor_const*,std::less<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>>>
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(second_type *)this_00);
  if (bVar1) {
    std::
    vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
    ::push_back((vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                 *)this_00,(value_type *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
  }
  return bVar1;
}

Assistant:

bool DescriptorPool::Tables::AddExtension(const FieldDescriptor* field) {
  DescriptorIntPair key(field->containing_type(), field->number());
  if (InsertIfNotPresent(&extensions_, key, field)) {
    extensions_after_checkpoint_.push_back(key);
    return true;
  } else {
    return false;
  }
}